

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

IVec4 __thiscall tcu::getTextureFormatBitDepth(tcu *this,TextureFormat *format)

{
  bool abVar1 [4];
  TextureSwizzle *pTVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Channel CVar6;
  Channel CVar8;
  Channel CVar9;
  Channel CVar10;
  undefined1 auVar7 [16];
  undefined1 auVar11 [16];
  Vector<int,_4> VVar12;
  IVec4 IVar13;
  IVec4 chnBits;
  tcu local_54 [16];
  Vector<bool,_4> local_44;
  Vector<int,_4> local_40;
  Vector<int,_4> local_30;
  
  getChannelBitDepth(local_54,format->type);
  pTVar2 = getChannelReadSwizzle(format->order);
  CVar6 = pTVar2->components[0] ^ 0x80000000;
  CVar8 = pTVar2->components[1] ^ 0x80000000;
  CVar9 = pTVar2->components[2] ^ 0x80000000;
  CVar10 = pTVar2->components[3] ^ 0x80000000;
  auVar7._0_4_ = -(uint)(-0x7ffffffd < (int)CVar6);
  auVar7._4_4_ = -(uint)(-0x7ffffffd < (int)CVar8);
  auVar7._8_4_ = -(uint)(-0x7ffffffd < (int)CVar9);
  auVar7._12_4_ = -(uint)(-0x7ffffffd < (int)CVar10);
  auVar7 = packssdw(auVar7,auVar7);
  auVar11._8_4_ = 0xffffffff;
  auVar11._0_8_ = 0xffffffffffffffff;
  auVar11._12_4_ = 0xffffffff;
  auVar7 = packsswb(auVar11 ^ auVar7,auVar11 ^ auVar7);
  abVar1 = (bool  [4])(auVar7._0_4_ & (uint)DAT_00994890);
  local_44.m_data[0] = abVar1[0];
  local_44.m_data[1] = abVar1[1];
  local_44.m_data[2] = abVar1[2];
  local_44.m_data[3] = abVar1[3];
  lVar5 = 0;
  lVar3 = (long)(int)pTVar2->components[0];
  if (-0x7ffffffd < (int)CVar6) {
    lVar3 = lVar5;
  }
  local_30.m_data[0] = *(int *)(local_54 + lVar3 * 4);
  lVar3 = (long)(int)pTVar2->components[1];
  if (-0x7ffffffd < (int)CVar8) {
    lVar3 = lVar5;
  }
  lVar4 = (long)(int)pTVar2->components[2];
  if (-0x7ffffffd < (int)CVar9) {
    lVar4 = lVar5;
  }
  local_30.m_data[1] = *(int *)(local_54 + lVar3 * 4);
  local_30.m_data[2] = *(int *)(local_54 + lVar4 * 4);
  lVar3 = (long)(int)pTVar2->components[3];
  if (-0x7ffffffd < (int)CVar10) {
    lVar3 = lVar5;
  }
  local_30.m_data[3] = *(int *)(local_54 + lVar3 * 4);
  Vector<int,_4>::Vector(&local_40,0);
  VVar12 = select<int,4>(this,&local_30,&local_40,&local_44);
  IVar13.m_data._8_8_ = VVar12.m_data._8_8_;
  IVar13.m_data._0_8_ = this;
  return (IVec4)IVar13.m_data;
}

Assistant:

IVec4 getTextureFormatBitDepth (const TextureFormat& format)
{
	const IVec4						chnBits		= getChannelBitDepth(format.type);
	const TextureSwizzle::Channel*	map			= getChannelReadSwizzle(format.order).components;
	const BVec4						chnMask		= BVec4(deInRange32(map[0], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[1], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[2], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[3], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE);
	const IVec4						chnSwz		= IVec4((chnMask[0]) ? ((int)map[0]) : (0),
														(chnMask[1]) ? ((int)map[1]) : (0),
														(chnMask[2]) ? ((int)map[2]) : (0),
														(chnMask[3]) ? ((int)map[3]) : (0));

	return select(chnBits.swizzle(chnSwz.x(), chnSwz.y(), chnSwz.z(), chnSwz.w()), IVec4(0), chnMask);
}